

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

void __thiscall
wasm::EffectAnalyzer::EffectAnalyzer(EffectAnalyzer *this,PassOptions *passOptions,Module *module)

{
  _Rb_tree_header *p_Var1;
  
  this->ignoreImplicitTraps = passOptions->ignoreImplicitTraps;
  this->trapsNeverHappen = passOptions->trapsNeverHappen;
  this->module = module;
  (this->features).features = (module->features).features;
  this->branchesOut = false;
  this->calls = false;
  p_Var1 = &(this->localsRead)._M_t._M_impl.super__Rb_tree_header;
  (this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->localsWritten)._M_t._M_impl.super__Rb_tree_header;
  (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header;
  (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->globalsWritten)._M_t._M_impl.super__Rb_tree_header;
  (this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->breakTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->trap = false;
  this->implicitTrap = false;
  this->isAtomic = false;
  this->throws_ = false;
  (this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->readsMemory = false;
  this->writesMemory = false;
  this->readsTable = false;
  this->writesTable = false;
  this->readsMutableStruct = false;
  this->writesStruct = false;
  this->readsArray = false;
  this->writesArray = false;
  *(undefined4 *)((long)&this->catchDepth + 7) = 0;
  this->tryDepth = 0;
  this->catchDepth = 0;
  (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->delegateTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

EffectAnalyzer(const PassOptions& passOptions, Module& module)
    : ignoreImplicitTraps(passOptions.ignoreImplicitTraps),
      trapsNeverHappen(passOptions.trapsNeverHappen), module(module),
      features(module.features) {}